

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::NegativeAPI::Run(NegativeAPI *this)

{
  GLenum GVar1;
  GLuint local_1c;
  long lStack_18;
  GLint res;
  long error;
  NegativeAPI *this_local;
  
  lStack_18 = 0;
  error = (long)this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92dc,(GLint *)&local_1c);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->buffer);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->buffer);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,local_1c,this->buffer);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar1 != 0x501) {
    glcts::anon_unknown_0::Output
              (
              "glBindBufferBase should generate INVALID_VALUE when index is greater than or equal GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.\n"
              );
    lStack_18 = -1;
  }
  glu::CallLogWrapper::glBindBufferRange
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,local_1c,this->buffer,0,4);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar1 != 0x501) {
    glcts::anon_unknown_0::Output
              (
              "glBindBufferRange should generate INVALID_VALUE when index is greater than or equal GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.\n"
              );
    lStack_18 = -1;
  }
  glu::CallLogWrapper::glBindBufferRange
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,local_1c - 1,this->buffer,3,4);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar1 != 0x501) {
    glcts::anon_unknown_0::Output
              (
              "glBindBufferRange should generate INVALID_VALUE when <offset> is not a multiple of four\n"
              );
    lStack_18 = -1;
  }
  return lStack_18;
}

Assistant:

virtual long Run()
	{
		long  error = NO_ERROR;
		GLint res;
		glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &res);
		glGenBuffers(1, &buffer);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, res, buffer);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glBindBufferBase should generate INVALID_VALUE when"
				   " index is greater than or equal GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.\n");
			error = ERROR;
		}
		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, res, buffer, 0, 4);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glBindBufferRange should generate INVALID_VALUE when"
				   " index is greater than or equal GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.\n");
			error = ERROR;
		}
		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, res - 1, buffer, 3, 4);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glBindBufferRange should generate INVALID_VALUE when"
				   " <offset> is not a multiple of four\n");
			error = ERROR;
		}
		return error;
	}